

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.h
# Opt level: O3

void __thiscall AST::AssignStmt::~AssignStmt(AssignStmt *this)

{
  Expr *pEVar1;
  
  (this->super_Stmt)._vptr_Stmt = (_func_int **)&PTR__AssignStmt_00181988;
  pEVar1 = (this->m_expr)._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
           super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl;
  if (pEVar1 != (Expr *)0x0) {
    (*(pEVar1->super_Stmt)._vptr_Stmt[1])();
  }
  (this->m_expr)._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>._M_t.
  super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
  super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  pEVar1 = (this->m_ident)._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
           super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl;
  if (pEVar1 != (Expr *)0x0) {
    (*(pEVar1->super_Stmt)._vptr_Stmt[1])();
  }
  operator_delete(this,0x18);
  return;
}

Assistant:

explicit AssignStmt(std::unique_ptr<Expr> ident, std::unique_ptr<Expr> expr)
        : m_ident(std::move(ident))
        , m_expr(std::move(expr)) { }